

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

_Bool monster_change_shape(monster_conflict *mon)

{
  byte *pbVar1;
  monster_shape *pmVar2;
  player_upkeep *ppVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  monster_race *pmVar9;
  monster_spell *pmVar10;
  player_race *ppVar11;
  source sVar12;
  source origin;
  bitflag summon_spells [13];
  
  pmVar2 = mon->race->shapes;
  if (pmVar2 == (monster_shape *)0x0) {
    wVar7 = L'\0';
    create_mon_spell_mask(summon_spells,0x400,0);
    flag_inter(summon_spells,mon->race->spell_flags,0xd);
    iVar6 = flag_next(summon_spells,0xd,1);
    uVar5 = 0;
    if (iVar6 != 0) {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        iVar6 = flag_next(summon_spells,0xd,iVar6 + 1);
      } while (iVar6 != 0);
    }
    if (uVar5 != 0) {
      uVar5 = Rand_div(uVar5);
      wVar7 = flag_next(summon_spells,0xd,1);
      if (0 < (int)uVar5) {
        do {
          wVar7 = flag_next(summon_spells,0xd,wVar7);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      pmVar10 = monster_spell_by_index(wVar7);
      wVar7 = pmVar10->effect->subtype;
      wVar8 = summon_name_to_idx("KIN");
      if (wVar7 == wVar8) {
        kin_base = mon->race->base;
      }
    }
    pmVar9 = select_shape((monster *)mon,wVar7);
  }
  else {
    for (uVar5 = Rand_div(mon->race->num_shapes); uVar5 != 0; uVar5 = uVar5 - 1) {
      pmVar2 = pmVar2->next;
    }
    pmVar9 = pmVar2->race;
    if (pmVar9 == (monster_race *)0x0) {
      shape_base = pmVar2->base;
      get_mon_num_prep(monster_base_shape_okay);
      pmVar9 = get_mon_num(player->depth + L'\x05',(int)player->depth);
      get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    }
  }
  _Var4 = monster_is_obvious((monster *)mon);
  if (_Var4) {
    monster_desc((char *)summon_spells,0x50,(monster *)mon,L'̔');
    msgt(0,"%s %s",summon_spells,"shimmers and changes!");
    ppVar3 = player->upkeep;
    if ((monster_conflict *)ppVar3->health_who == mon) {
      pbVar1 = (byte *)((long)&ppVar3->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    pbVar1 = (byte *)((long)&ppVar3->redraw + 2);
    *pbVar1 = *pbVar1 | 0x40;
    square_light_spot((chunk *)cave,mon->grid);
  }
  if (pmVar9 != (monster_race *)0x0) {
    if (mon->original_race == (monster_race *)0x0) {
      mon->original_race = mon->race;
      if (mon->original_player_race != (player_race *)0x0) {
        __assert_fail("!mon->original_player_race",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                      ,0x6cb,"_Bool monster_change_shape(struct monster *)");
      }
      mon->original_player_race = mon->player_race;
    }
    mon->race = pmVar9;
    _Var4 = flag_has_dbg(pmVar9->flags,0xc,0x24,"race->flags","RF_PLAYER");
    if (_Var4) {
      ppVar11 = get_player_race();
    }
    else {
      ppVar11 = (player_race *)0x0;
    }
    mon->player_race = ppVar11;
    mon->mspeed = mon->mspeed + ((char)mon->race->speed - (char)mon->original_race->speed);
  }
  _Var4 = monster_passes_walls((monster *)mon);
  if ((!_Var4) && (_Var4 = square_is_monster_walkable(cave,mon->grid), !_Var4)) {
    sVar12 = source_monster(mon->midx);
    origin.which = sVar12.which;
    origin._4_4_ = 0;
    origin.what = sVar12.what;
    effect_simple(L';',origin,"1",L'\0',L'\0',L'\0',(mon->grid).y,(mon->grid).x,(_Bool *)0x0);
  }
  return mon->original_race != (monster_race *)0x0;
}

Assistant:

bool monster_change_shape(struct monster *mon)
{
	struct monster_shape *shape = mon->race->shapes;
	struct monster_race *race = NULL;

	/* Use the monster's preferred shapes if any */
	if (shape) {
		/* Pick one */
		int choice = randint0(mon->race->num_shapes);
		while (choice--) {
			shape = shape->next;
		}

		/* Race or base? */
		if (shape->race) {
			/* Simple */
			race = shape->race;
		} else {
			/* Set the shape base */
			shape_base = shape->base;

			/* Choose a race of the given base */
			get_mon_num_prep(monster_base_shape_okay);

			/* Pick a random race */
			race = get_mon_num(player->depth + 5, player->depth);

			/* Reset allocation table */
			get_mon_num_prep(NULL);
		}
	} else {
		/* Choose something the monster can summon */
		bitflag summon_spells[RSF_SIZE];
		int i, poss = 0, which, index, summon_type = 0;
		const struct monster_spell *spell;

		/* Extract the summon spells */
		create_mon_spell_mask(summon_spells, RST_SUMMON, RST_NONE);
		rsf_inter(summon_spells, mon->race->spell_flags);

		/* Count possibilities */
		for (i = rsf_next(summon_spells, FLAG_START); i != FLAG_END;
			 i = rsf_next(summon_spells, i + 1)) {
			poss++;
		}

		/* Pick one (defaults to ANY if no summons) */
		if (poss) {
			which = randint0(poss);
			index = rsf_next(summon_spells, FLAG_START);
			for (i = 0; i < which; i++) {
				index = rsf_next(summon_spells, index);
			}
			spell = monster_spell_by_index(index);

			/* Set the summon type, and the kin_base if necessary */
			summon_type = spell->effect->subtype;
			if (summon_type == summon_name_to_idx("KIN")) {
				kin_base = mon->race->base;
			}
		}

		/* Choose a race */
		race = select_shape(mon, summon_type);
	}

	/* Print a message immediately, update visuals */
	if (monster_is_obvious(mon)) {
		char m_name[80];
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
		msgt(MSG_GENERIC, "%s %s", m_name, "shimmers and changes!");
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
		square_light_spot(cave, mon->grid);
	}

	/* Set the race */
	if (race) {
		if (!mon->original_race) {
			mon->original_race = mon->race;
			assert(!mon->original_player_race);
			mon->original_player_race = mon->player_race;
		}
		mon->race = race;
		if (rf_has(race->flags, RF_PLAYER)) {
			mon->player_race = get_player_race();
		} else {
			mon->player_race = NULL;
		}
		mon->mspeed += mon->race->speed - mon->original_race->speed;
	}

	/* Emergency teleport if needed */
	if (!monster_passes_walls(mon) &&
		!square_is_monster_walkable(cave, mon->grid)) {
		effect_simple(EF_TELEPORT, source_monster(mon->midx), "1", 0, 0, 0,
					  mon->grid.y, mon->grid.x, NULL);
	}

	return mon->original_race != NULL;
}